

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O2

void duckdb::UniqueFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,short,std::unordered_map<short,unsigned_long,std::hash<short>,std::equal_to<short>,std::allocator<std::pair<short_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  idx_t iVar3;
  undefined8 uVar4;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(state_vector,count,&local_68);
  pdVar1 = result->data;
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    iVar3 = iVar2;
    if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
      iVar3 = (idx_t)(local_68.sel)->sel_vector[iVar2];
    }
    if (**(long **)(local_68.data + iVar3 * 8) == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined8 *)(**(long **)(local_68.data + iVar3 * 8) + 0x18);
    }
    *(undefined8 *)(pdVar1 + iVar2 * 8) = uVar4;
  }
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_68);
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto result_data = FlatVector::GetData<uint64_t>(result);
		for (idx_t i = 0; i < count; i++) {

			auto state = states[sdata.sel->get_index(i)];

			if (!state->hist) {
				result_data[i] = 0;
				continue;
			}
			result_data[i] = state->hist->size();
		}
		result.Verify(count);
	}